

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtest.c
# Opt level: O0

int xptrDocTest(char *filename,char *resul,char *err,int options)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *subdir;
  int res;
  int ret;
  size_t i;
  glob_t globbuf;
  char result [500];
  char local_228 [8];
  char pattern [500];
  int options_local;
  char *err_local;
  char *resul_local;
  char *filename_local;
  
  subdir._4_4_ = 0;
  pcVar2 = "xptr";
  if (options == -1) {
    pcVar2 = "xptr-xp1";
  }
  xpathDocument = (xmlDocPtr)xmlReadFile(filename,0,10);
  if (xpathDocument == (xmlDocPtr)0x0) {
    fprintf(_stderr,"Failed to load %s\n",filename);
    filename_local._4_4_ = -1;
  }
  else {
    pcVar3 = baseFilename(filename);
    iVar1 = snprintf(local_228,499,"./test/XPath/%s/%s*",pcVar2,pcVar3);
    if (0x1f2 < iVar1) {
      pattern[0x1eb] = '\0';
    }
    globbuf.gl_pathv = (char **)0x0;
    glob64(local_228,8,(__errfunc *)0x0,(glob64_t *)&i);
    for (_res = 0; _res < i; _res = _res + 1) {
      pcVar3 = baseFilename(*(char **)(globbuf.gl_pathc + _res * 8));
      snprintf((char *)&globbuf.gl_stat,499,"result/XPath/%s/%s",pcVar2,pcVar3);
      iVar1 = xpathCommonTest(*(char **)(globbuf.gl_pathc + _res * 8),(char *)&globbuf.gl_stat,1,0);
      if (iVar1 != 0) {
        subdir._4_4_ = iVar1;
      }
    }
    globfree64((glob64_t *)&i);
    xmlFreeDoc(xpathDocument);
    filename_local._4_4_ = subdir._4_4_;
  }
  return filename_local._4_4_;
}

Assistant:

static int
xptrDocTest(const char *filename,
            const char *resul ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {

    char pattern[500];
    char result[500];
    glob_t globbuf;
    size_t i;
    int ret = 0, res;
    const char *subdir = options == -1 ? "xptr-xp1" : "xptr";

    xpathDocument = xmlReadFile(filename, NULL,
                                XML_PARSE_DTDATTR | XML_PARSE_NOENT);
    if (xpathDocument == NULL) {
        fprintf(stderr, "Failed to load %s\n", filename);
	return(-1);
    }

    res = snprintf(pattern, 499, "./test/XPath/%s/%s*",
            subdir, baseFilename(filename));
    if (res >= 499)
        pattern[499] = 0;
    globbuf.gl_offs = 0;
    glob(pattern, GLOB_DOOFFS, NULL, &globbuf);
    for (i = 0;i < globbuf.gl_pathc;i++) {
        res = snprintf(result, 499, "result/XPath/%s/%s",
	         subdir, baseFilename(globbuf.gl_pathv[i]));
        if (res >= 499)
            result[499] = 0;
	res = xpathCommonTest(globbuf.gl_pathv[i], &result[0], 1, 0);
	if (res != 0)
	    ret = res;
    }
    globfree(&globbuf);

    xmlFreeDoc(xpathDocument);
    return(ret);
}